

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O3

bool ClientUtils::IsValidMulticastIP(string *i_MulticastIPAddress)

{
  int iVar1;
  char *__cp;
  size_type sVar2;
  _func_int ***ppp_Var3;
  uint uVar4;
  _Alloc_hider _Var5;
  size_type this;
  bool bVar6;
  int iVar7;
  int *piVar8;
  execution_context eVar9;
  uint uVar10;
  service *psVar11;
  undefined8 uVar12;
  long lVar13;
  error_code Error;
  io_service Service;
  resolver Resolver;
  query Query;
  undefined8 local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  uint local_11c;
  io_context local_118;
  string local_108;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_e8;
  basic_resolver_query<boost::asio::ip::tcp> local_a0;
  
  boost::asio::io_context::io_context(&local_118);
  boost::system::error_code::error_code((error_code *)&local_138);
  __cp = (i_MulticastIPAddress->_M_dataplus)._M_p;
  piVar8 = __errno_location();
  *piVar8 = 0;
  iVar7 = inet_pton(2,__cp,&local_a0);
  iVar1 = *piVar8;
  if (boost::system::system_category()::system_category_instance == '\0') {
    IsValidMulticastIP();
  }
  bVar6 = (bool)(**(code **)(boost::system::system_category()::system_category_instance + 0x30))
                          (&boost::system::system_category()::system_category_instance,iVar1);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT17(local_e8.service_._2_1_,
                          CONCAT25(local_e8.service_._0_2_,CONCAT14(bVar6,iVar1)));
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                &boost::system::system_category()::system_category_instance;
  if (iVar7 < 1) {
    if (bVar6 == false) {
      boost::system::error_code::operator=((error_code *)&local_138,invalid_argument);
      uVar10 = 0;
      if (((ulong)local_138 & 0x100000000) == 0) goto LAB_0014d38d;
    }
    else {
      uVar10 = 0;
    }
LAB_0014d24a:
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::io_object_impl<boost::asio::io_context>(&local_e8,&local_118,(type *)0x0);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
              (&local_a0,i_MulticastIPAddress,&local_108,address_configured);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    boost::asio::detail::resolver_service<boost::asio::ip::tcp>::resolve
              ((results_type *)&local_108,
               (resolver_service<boost::asio::ip::tcp> *)
               CONCAT53(local_e8.service_._3_5_,
                        CONCAT12(local_e8.service_._2_1_,local_e8.service_._0_2_)),
               &local_e8.implementation_,&local_a0,(error_code *)&local_138);
    this = local_108._M_string_length;
    _Var5._M_p = local_108._M_dataplus._M_p;
    uVar4 = 0;
    if ((local_138._4_1_ == false) &&
       (uVar4 = uVar10,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_108._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      lVar13 = local_108.field_2._M_allocated_capacity * 0x60 + 4;
      uVar12 = local_108.field_2._M_allocated_capacity;
      local_11c = uVar10;
      do {
        boost::system::error_code::error_code((error_code *)&local_108);
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p;
        p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
        sVar2 = *(size_type *)_Var5._M_p;
        if (*(short *)((sVar2 - 4) + lVar13) == 2) {
          uVar4 = *(uint *)(sVar2 + lVar13);
          break;
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x60;
        uVar4 = local_11c;
      } while (uVar12 != ((long)(*(long *)(_Var5._M_p + 8) - sVar2) >> 5) * -0x5555555555555555);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
      operator_delete(local_a0.service_name_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
      operator_delete(local_a0.host_name_._M_dataplus._M_p);
    }
    boost::asio::detail::
    io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~io_object_impl(&local_e8);
    uVar10 = uVar4;
  }
  else {
    uVar10 = local_a0.hints_.ai_flags;
    if (bVar6 != false) goto LAB_0014d24a;
  }
LAB_0014d38d:
  psVar11 = (local_118.super_execution_context.service_registry_)->first_service_;
  eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
  if (psVar11 != (service *)0x0) {
    do {
      (*psVar11->_vptr_service[2])(psVar11);
      eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
      psVar11 = psVar11->next_;
    } while (psVar11 != (service *)0x0);
    psVar11 = (local_118.super_execution_context.service_registry_)->first_service_;
    if (psVar11 != (service *)0x0) {
      do {
        ppp_Var3 = &psVar11->_vptr_service;
        psVar11 = psVar11->next_;
        (*(*ppp_Var3)[1])();
        (eVar9.service_registry_)->first_service_ = psVar11;
      } while (psVar11 != (service *)0x0);
      eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
      if (local_118.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar9.service_registry_ = (service_registry *)0x0;
        goto LAB_0014d3e4;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar9.service_registry_)->mutex_);
LAB_0014d3e4:
  operator_delete(eVar9.service_registry_);
  return uVar10 == 0xffffffff || (uVar10 & 0xf0) == 0xe0;
}

Assistant:

bool IsValidMulticastIP( const std::string & i_MulticastIPAddress )
  {
    boost::asio::io_service Service;
    boost::system::error_code Error;
    boost::asio::ip::address_v4 Address = boost::asio::ip::address_v4::from_string( i_MulticastIPAddress, Error );
    if( Error )
    {
      boost::asio::ip::tcp::resolver Resolver( Service );
      boost::asio::ip::tcp::resolver::query Query( i_MulticastIPAddress, "" );
      
      boost::asio::ip::tcp::resolver::iterator It = Resolver.resolve( Query, Error );
      boost::asio::ip::tcp::resolver::iterator End;
      
      if( ! Error )
      {
        for( ; It != End; ++It )
        {
          Error = boost::system::error_code();
          boost::asio::ip::tcp::endpoint EndPoint( *It );

          // Currently we only handle IPv4
          if( EndPoint.address().is_v4() )
          {
            Address = EndPoint.address().to_v4();
            break;
          }
        }
      }
      else
      {
        Address = boost::asio::ip::address_v4();
      }
    }

    return( Address.is_multicast() || ( Address.to_ulong() == 0xFFFFFFFF ) );
  }